

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isDistinctRedundant(Parse *pParse,SrcList *pTabList,WhereClause *pWC,ExprList *pDistinct)

{
  int iCur;
  Table *pTVar1;
  int iVar2;
  Expr *pEVar3;
  WhereTerm *pWVar4;
  Expr *p;
  int iBase;
  int i;
  Index *pIdx;
  Table *pTab;
  ExprList *pDistinct_local;
  WhereClause *pWC_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  if (pTabList->nSrc == 1) {
    iCur = pTabList->a[0].iCursor;
    pTVar1 = pTabList->a[0].pTab;
    for (p._4_4_ = 0; (int)p._4_4_ < pDistinct->nExpr; p._4_4_ = p._4_4_ + 1) {
      pEVar3 = sqlite3ExprSkipCollateAndLikely(pDistinct->a[(int)p._4_4_].pExpr);
      if ((pEVar3 != (Expr *)0x0) &&
         ((((pEVar3->op == 0xa7 || (pEVar3->op == 0xa9)) && (pEVar3->iTable == iCur)) &&
          (pEVar3->iColumn < 0)))) {
        return 1;
      }
    }
    for (_iBase = pTVar1->pIndex; _iBase != (Index *)0x0; _iBase = _iBase->pNext) {
      if ((_iBase->onError != '\0') && (_iBase->pPartIdxWhere == (Expr *)0x0)) {
        p._4_4_ = 0;
        while (((int)p._4_4_ < (int)(uint)_iBase->nKeyCol &&
               ((pWVar4 = sqlite3WhereFindTerm(pWC,iCur,p._4_4_,0xffffffffffffffff,2,_iBase),
                pWVar4 != (WhereTerm *)0x0 ||
                ((iVar2 = findIndexCol(pParse,pDistinct,iCur,_iBase,p._4_4_), -1 < iVar2 &&
                 (iVar2 = indexColumnNotNull(_iBase,p._4_4_), iVar2 != 0))))))) {
          p._4_4_ = p._4_4_ + 1;
        }
        if (p._4_4_ == _iBase->nKeyCol) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int isDistinctRedundant(
  Parse *pParse,            /* Parsing context */
  SrcList *pTabList,        /* The FROM clause */
  WhereClause *pWC,         /* The WHERE clause */
  ExprList *pDistinct       /* The result set that needs to be DISTINCT */
){
  Table *pTab;
  Index *pIdx;
  int i;
  int iBase;

  /* If there is more than one table or sub-select in the FROM clause of
  ** this query, then it will not be possible to show that the DISTINCT
  ** clause is redundant. */
  if( pTabList->nSrc!=1 ) return 0;
  iBase = pTabList->a[0].iCursor;
  pTab = pTabList->a[0].pTab;

  /* If any of the expressions is an IPK column on table iBase, then return
  ** true. Note: The (p->iTable==iBase) part of this test may be false if the
  ** current SELECT is a correlated sub-query.
  */
  for(i=0; i<pDistinct->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollateAndLikely(pDistinct->a[i].pExpr);
    if( NEVER(p==0) ) continue;
    if( p->op!=TK_COLUMN && p->op!=TK_AGG_COLUMN ) continue;
    if( p->iTable==iBase && p->iColumn<0 ) return 1;
  }

  /* Loop through all indices on the table, checking each to see if it makes
  ** the DISTINCT qualifier redundant. It does so if:
  **
  **   1. The index is itself UNIQUE, and
  **
  **   2. All of the columns in the index are either part of the pDistinct
  **      list, or else the WHERE clause contains a term of the form "col=X",
  **      where X is a constant value. The collation sequences of the
  **      comparison and select-list expressions must match those of the index.
  **
  **   3. All of those index columns for which the WHERE clause does not
  **      contain a "col=X" term are subject to a NOT NULL constraint.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( !IsUniqueIndex(pIdx) ) continue;
    if( pIdx->pPartIdxWhere ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( 0==sqlite3WhereFindTerm(pWC, iBase, i, ~(Bitmask)0, WO_EQ, pIdx) ){
        if( findIndexCol(pParse, pDistinct, iBase, pIdx, i)<0 ) break;
        if( indexColumnNotNull(pIdx, i)==0 ) break;
      }
    }
    if( i==pIdx->nKeyCol ){
      /* This index implies that the DISTINCT qualifier is redundant. */
      return 1;
    }
  }

  return 0;
}